

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::EnableStmtVisitor::visit(EnableStmtVisitor *this,AssignStmt *stmt)

{
  AssignmentType AVar1;
  Var **ppVVar2;
  ulong uVar3;
  Var *target;
  undefined1 local_40 [8];
  string str_value;
  Var *left;
  AssignStmt *stmt_local;
  EnableStmtVisitor *this_local;
  
  left = (Var *)stmt;
  stmt_local = (AssignStmt *)this;
  AVar1 = AssignStmt::assign_type(stmt);
  if (AVar1 == Blocking) {
    ppVVar2 = AssignStmt::left((AssignStmt *)left);
    str_value.field_2._8_8_ = *ppVVar2;
    get_ssa_enable_condition_abi_cxx11_
              ((string *)local_40,(EnableStmtVisitor *)str_value.field_2._8_8_,target);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::
      unordered_map<kratos::Stmt_const*,std::__cxx11::string,std::hash<kratos::Stmt_const*>,std::equal_to<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>>
      ::emplace<kratos::AssignStmt*&,std::__cxx11::string&>
                ((unordered_map<kratos::Stmt_const*,std::__cxx11::string,std::hash<kratos::Stmt_const*>,std::equal_to<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>>
                  *)&this->values,(AssignStmt **)&left,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
        // we're only interested in top level blocking assignment
        if (stmt->assign_type() != AssignmentType::Blocking) return;
        auto* left = stmt->left();
        auto str_value = get_ssa_enable_condition(left);
        if (!str_value.empty()) {
            values.emplace(stmt, str_value);
        }
    }